

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O1

void __thiscall
soplex::
SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::unsimplify(SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *x,
            VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *y,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *s,VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *r,VarStatus *rows,VarStatus *cols,bool isOptimal)

{
  Array<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>
  *this_00;
  byte *pbVar1;
  char cVar2;
  SPxSense SVar3;
  SPxOut *pSVar4;
  undefined8 uVar5;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pVVar6;
  undefined8 uVar7;
  long *plVar8;
  pointer pnVar9;
  pointer pnVar10;
  int iVar11;
  pointer pnVar12;
  long lVar13;
  long lVar14;
  Verbosity *pVVar15;
  uint *puVar16;
  uint *puVar17;
  Verbosity *pVVar18;
  Verbosity *pVVar19;
  uint *puVar20;
  cpp_dec_float<200U,_int,_void> *pcVar21;
  long lVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  byte bVar26;
  Verbosity old_verbosity;
  undefined1 auStack_4d4 [12];
  undefined1 local_4c8 [16];
  undefined1 local_4b8 [16];
  undefined1 local_4a8 [16];
  undefined1 local_498 [16];
  undefined1 local_488 [16];
  undefined1 local_478 [13];
  undefined3 uStack_46b;
  Verbosity VStack_468;
  bool bStack_464;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_460;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_458;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_450;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_448;
  undefined8 uStack_440;
  DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
  *local_430;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_428;
  undefined4 local_41c;
  VarStatus *local_418;
  cpp_dec_float<200U,_int,_void> local_3f0;
  cpp_dec_float<200U,_int,_void> local_370;
  cpp_dec_float<200U,_int,_void> local_2f0;
  cpp_dec_float<200U,_int,_void> local_270;
  uint local_1f0 [28];
  uint local_180 [28];
  uint local_110 [28];
  uint local_a0 [28];
  
  bVar26 = 0;
  pSVar4 = (this->
           super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).spxout;
  local_458 = x;
  local_450 = y;
  local_430 = (DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
               *)r;
  local_428 = s;
  local_418 = rows;
  if ((pSVar4 != (SPxOut *)0x0) && (2 < (int)pSVar4->m_verbosity)) {
    old_verbosity = pSVar4->m_verbosity;
    local_41c = 3;
    (*pSVar4->_vptr_SPxOut[2])();
    pSVar4 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    std::__ostream_insert<char,std::char_traits<char>>
              (pSVar4->m_streams[pSVar4->m_verbosity]," --- unsimplifying solution and basis",0x25);
    cVar2 = (char)pSVar4->m_streams[pSVar4->m_verbosity];
    std::ios::widen((char)*(undefined8 *)(*(long *)pSVar4->m_streams[pSVar4->m_verbosity] + -0x18) +
                    cVar2);
    std::ostream::put(cVar2);
    std::ostream::flush();
    pSVar4 = (this->
             super_SPxSimplifier<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).spxout;
    (*pSVar4->_vptr_SPxOut[2])(pSVar4,&old_verbosity);
  }
  pnVar12 = (local_458->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_458->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12) >> 7)) {
    lVar22 = 0x1e;
    lVar23 = 0;
    do {
      puVar17 = (pnVar12->m_backend).data._M_elems + lVar22;
      puVar16 = puVar17 + 0xffffffffffffffe2;
      puVar20 = local_a0;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar20 = *puVar16;
        puVar16 = puVar16 + (ulong)bVar26 * -2 + 1;
        puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
      }
      iVar11 = puVar17[0xfffffffffffffffe];
      cVar2 = *(char *)(puVar17 + 0xffffffffffffffff);
      uVar5._0_4_ = puVar17[0];
      uVar5._4_4_ = puVar17[1];
      uStack_440 = 0;
      local_448 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)uVar5;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_270,this);
      puVar17 = local_a0;
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar21->data)._M_elems[0] = *puVar17;
        puVar17 = puVar17 + (ulong)bVar26 * -2 + 1;
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar26 * -8 + 4);
      }
      bStack_464 = (bool)cVar2;
      if ((cVar2 == '\x01') &&
         (old_verbosity != ERROR || (fpclass_type)local_448 != cpp_dec_float_finite)) {
        bStack_464 = false;
      }
      if (((fpclass_type)local_448 == cpp_dec_float_NaN) || (local_270.fpclass == cpp_dec_float_NaN)
         ) {
LAB_0054ecb8:
        puVar17 = (((local_458->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar22;
        pVVar18 = puVar17 + 0xffffffffffffffe2;
        pVVar15 = &old_verbosity;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *pVVar15 = *pVVar18;
          pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
          pVVar15 = pVVar15 + (ulong)bVar26 * -2 + 1;
        }
        VStack_468 = puVar17[0xfffffffffffffffe];
        bStack_464 = (bool)*(undefined1 *)(puVar17 + 0xffffffffffffffff);
        local_460 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)*(undefined8 *)puVar17;
      }
      else {
        VStack_468 = iVar11;
        local_460 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)uVar5;
        iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&local_270);
        if (0 < iVar11) goto LAB_0054ecb8;
        local_460 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x1c00000000;
        _old_verbosity = (undefined1  [16])0x0;
        local_4c8 = (undefined1  [16])0x0;
        local_4b8 = (undefined1  [16])0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = SUB1613((undefined1  [16])0x0,0);
        uStack_46b = 0;
        VStack_468 = 0;
        bStack_464 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
      }
      puVar17 = (((this->m_prim).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar22;
      pVVar18 = &old_verbosity;
      pVVar15 = puVar17 + 0xffffffffffffffe2;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *pVVar15 = *pVVar18;
        pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
        pVVar15 = pVVar15 + (ulong)bVar26 * -2 + 1;
      }
      puVar17[0xfffffffffffffffe] = VStack_468;
      *(bool *)(puVar17 + 0xffffffffffffffff) = bStack_464;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)puVar17 = local_460;
      puVar17 = (uint *)(*(long *)local_430 + -0x78 + lVar22 * 4);
      puVar16 = puVar17;
      puVar20 = local_110;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar20 = *puVar16;
        puVar16 = puVar16 + (ulong)bVar26 * -2 + 1;
        puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
      }
      uVar24 = puVar17[0x1c];
      cVar2 = (char)puVar17[0x1d];
      pVVar6 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 **)(puVar17 + 0x1e);
      uStack_440 = 0;
      local_448 = pVVar6;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_2f0,this);
      puVar17 = local_110;
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar21->data)._M_elems[0] = *puVar17;
        puVar17 = puVar17 + (ulong)bVar26 * -2 + 1;
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar26 * -8 + 4);
      }
      bStack_464 = (bool)cVar2;
      if ((cVar2 == '\x01') && (old_verbosity != ERROR || (fpclass_type)local_448 != 0)) {
        bStack_464 = false;
      }
      if (((fpclass_type)local_448 == 2) || (local_2f0.fpclass == cpp_dec_float_NaN)) {
LAB_0054ee8b:
        SVar3 = this->m_thesense;
        lVar13 = *(long *)local_430;
        pVVar18 = (Verbosity *)(lVar13 + -0x78 + lVar22 * 4);
        pVVar15 = pVVar18;
        pVVar19 = &old_verbosity;
        for (lVar14 = 0x1c; lVar14 != 0; lVar14 = lVar14 + -1) {
          *pVVar19 = *pVVar15;
          pVVar15 = pVVar15 + (ulong)bVar26 * -2 + 1;
          pVVar19 = pVVar19 + (ulong)bVar26 * -2 + 1;
        }
        VStack_468 = pVVar18[0x1c];
        if (SVar3 == MAXIMIZE) {
          bStack_464 = *(bool *)(lVar13 + -4 + lVar22 * 4);
          local_460 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                        **)(lVar13 + lVar22 * 4);
          if ((fpclass_type)local_460 != cpp_dec_float_finite || old_verbosity != ERROR) {
            bStack_464 = (bool)(bStack_464 ^ 1);
          }
        }
        else {
          bStack_464 = (bool)*(byte *)(lVar13 + -4 + lVar22 * 4);
          local_460 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)*(undefined8 *)(lVar13 + lVar22 * 4);
        }
      }
      else {
        VStack_468 = uVar24;
        local_460 = pVVar6;
        iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&local_2f0);
        if (0 < iVar11) goto LAB_0054ee8b;
        local_460 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x1c00000000;
        _old_verbosity = (undefined1  [16])0x0;
        local_4c8 = (undefined1  [16])0x0;
        local_4b8 = (undefined1  [16])0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = SUB1613((undefined1  [16])0x0,0);
        uStack_46b = 0;
        VStack_468 = ERROR;
        bStack_464 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
      }
      puVar17 = (((this->m_redCost).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar22;
      pVVar18 = &old_verbosity;
      pVVar15 = puVar17 + 0xffffffffffffffe2;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *pVVar15 = *pVVar18;
        pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
        pVVar15 = pVVar15 + (ulong)bVar26 * -2 + 1;
      }
      puVar17[0xfffffffffffffffe] = VStack_468;
      *(bool *)(puVar17 + 0xffffffffffffffff) = bStack_464;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)puVar17 = local_460;
      (this->m_cBasisStat).data[lVar23] = cols[lVar23];
      lVar23 = lVar23 + 1;
      pnVar12 = (local_458->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x20;
    } while (lVar23 < (int)((ulong)((long)(local_458->val).
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12
                                   ) >> 7));
  }
  pnVar12 = (local_450->val).
            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(local_450->val).
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12) >> 7)) {
    lVar22 = 0x1e;
    lVar23 = 0;
    do {
      puVar17 = (pnVar12->m_backend).data._M_elems + lVar22;
      puVar16 = puVar17 + 0xffffffffffffffe2;
      puVar20 = local_180;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar20 = *puVar16;
        puVar16 = puVar16 + (ulong)bVar26 * -2 + 1;
        puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
      }
      iVar11 = puVar17[0xfffffffffffffffe];
      cVar2 = *(char *)(puVar17 + 0xffffffffffffffff);
      uVar7._0_4_ = puVar17[0];
      uVar7._4_4_ = puVar17[1];
      uStack_440 = 0;
      local_448 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)uVar7;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_370,this);
      puVar17 = local_180;
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar21->data)._M_elems[0] = *puVar17;
        puVar17 = puVar17 + (ulong)bVar26 * -2 + 1;
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar26 * -8 + 4);
      }
      bStack_464 = (bool)cVar2;
      if ((cVar2 == '\x01') &&
         (old_verbosity != ERROR || (fpclass_type)local_448 != cpp_dec_float_finite)) {
        bStack_464 = false;
      }
      if (((fpclass_type)local_448 == cpp_dec_float_NaN) || (local_370.fpclass == cpp_dec_float_NaN)
         ) {
LAB_0054f0f5:
        SVar3 = this->m_thesense;
        pnVar12 = (local_450->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar17 = (pnVar12->m_backend).data._M_elems + lVar22 + -0x1e;
        puVar16 = puVar17;
        pVVar18 = &old_verbosity;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *pVVar18 = *puVar16;
          puVar16 = puVar16 + (ulong)bVar26 * -2 + 1;
          pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
        }
        VStack_468 = puVar17[0x1c];
        if (SVar3 == MAXIMIZE) {
          bStack_464 = SUB41((pnVar12->m_backend).data._M_elems[lVar22 + -1],0);
          puVar17 = (pnVar12->m_backend).data._M_elems + lVar22;
          local_460._0_4_ = puVar17[0];
          local_460._4_4_ = puVar17[1];
          if ((fpclass_type)local_460 != cpp_dec_float_finite || old_verbosity != ERROR) {
            bStack_464 = (bool)(bStack_464 ^ 1);
          }
        }
        else {
          bStack_464 = (bool)(byte)(pnVar12->m_backend).data._M_elems[lVar22 + -1];
          local_460 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       *)*(undefined8 *)((pnVar12->m_backend).data._M_elems + lVar22);
        }
      }
      else {
        VStack_468 = iVar11;
        local_460 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)uVar7;
        iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&local_370);
        if (0 < iVar11) goto LAB_0054f0f5;
        local_460 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x1c00000000;
        _old_verbosity = (undefined1  [16])0x0;
        local_4c8 = (undefined1  [16])0x0;
        local_4b8 = (undefined1  [16])0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = SUB1613((undefined1  [16])0x0,0);
        uStack_46b = 0;
        VStack_468 = 0;
        bStack_464 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
      }
      puVar17 = (((this->m_dual).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar22;
      pVVar18 = &old_verbosity;
      pVVar15 = puVar17 + 0xffffffffffffffe2;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *pVVar15 = *pVVar18;
        pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
        pVVar15 = pVVar15 + (ulong)bVar26 * -2 + 1;
      }
      puVar17[0xfffffffffffffffe] = VStack_468;
      *(bool *)(puVar17 + 0xffffffffffffffff) = bStack_464;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)puVar17 = local_460;
      puVar17 = (((local_428->val).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                lVar22 + -0x1e;
      puVar16 = puVar17;
      puVar20 = local_1f0;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *puVar20 = *puVar16;
        puVar16 = puVar16 + (ulong)bVar26 * -2 + 1;
        puVar20 = puVar20 + (ulong)bVar26 * -2 + 1;
      }
      uVar24 = puVar17[0x1c];
      cVar2 = (char)puVar17[0x1d];
      pVVar6 = *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 **)(puVar17 + 0x1e);
      uStack_440 = 0;
      local_448 = pVVar6;
      epsZero((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)&local_3f0,this);
      puVar17 = local_1f0;
      pcVar21 = (cpp_dec_float<200U,_int,_void> *)&old_verbosity;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        (pcVar21->data)._M_elems[0] = *puVar17;
        puVar17 = puVar17 + (ulong)bVar26 * -2 + 1;
        pcVar21 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar21 + (ulong)bVar26 * -8 + 4);
      }
      bStack_464 = (bool)cVar2;
      if ((cVar2 == '\x01') && (old_verbosity != ERROR || (fpclass_type)local_448 != 0)) {
        bStack_464 = false;
      }
      if (((fpclass_type)local_448 == 2) || (local_3f0.fpclass == cpp_dec_float_NaN)) {
LAB_0054f300:
        puVar17 = (((local_428->val).
                    super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar22;
        pVVar18 = puVar17 + 0xffffffffffffffe2;
        pVVar15 = &old_verbosity;
        for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
          *pVVar15 = *pVVar18;
          pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
          pVVar15 = pVVar15 + (ulong)bVar26 * -2 + 1;
        }
        VStack_468 = puVar17[0xfffffffffffffffe];
        bStack_464 = (bool)*(byte *)(puVar17 + 0xffffffffffffffff);
        local_460 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)*(undefined8 *)puVar17;
      }
      else {
        VStack_468 = uVar24;
        local_460 = pVVar6;
        iVar11 = boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::compare
                           ((cpp_dec_float<200U,_int,_void> *)&old_verbosity,&local_3f0);
        if (0 < iVar11) goto LAB_0054f300;
        local_460 = (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x1c00000000;
        _old_verbosity = (undefined1  [16])0x0;
        local_4c8 = (undefined1  [16])0x0;
        local_4b8 = (undefined1  [16])0x0;
        local_4a8 = (undefined1  [16])0x0;
        local_498 = (undefined1  [16])0x0;
        local_488 = (undefined1  [16])0x0;
        local_478 = SUB1613((undefined1  [16])0x0,0);
        uStack_46b = 0;
        VStack_468 = ERROR;
        bStack_464 = false;
        boost::multiprecision::backends::cpp_dec_float<200u,int,void>::operator=
                  ((cpp_dec_float<200u,int,void> *)&old_verbosity,0.0);
      }
      puVar17 = (((this->m_slack).val.
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems + lVar22;
      pVVar18 = &old_verbosity;
      pVVar15 = puVar17 + 0xffffffffffffffe2;
      for (lVar13 = 0x1c; lVar13 != 0; lVar13 = lVar13 + -1) {
        *pVVar15 = *pVVar18;
        pVVar18 = pVVar18 + (ulong)bVar26 * -2 + 1;
        pVVar15 = pVVar15 + (ulong)bVar26 * -2 + 1;
      }
      puVar17[0xfffffffffffffffe] = VStack_468;
      *(bool *)(puVar17 + 0xffffffffffffffff) = bStack_464;
      *(VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        **)puVar17 = local_460;
      (this->m_rBasisStat).data[lVar23] = local_418[lVar23];
      lVar23 = lVar23 + 1;
      pnVar12 = (local_450->val).
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar22 = lVar22 + 0x20;
    } while (lVar23 < (int)((ulong)((long)(local_450->val).
                                          super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12
                                   ) >> 7));
  }
  this_00 = &this->m_hist;
  uVar24 = (uint)((ulong)((long)(this->m_hist).data.
                                super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_hist).data.
                               super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
  if (0 < (int)uVar24) {
    local_448 = &this->m_prim;
    local_450 = &this->m_dual;
    local_458 = &this->m_slack;
    local_428 = &this->m_redCost;
    local_430 = &this->m_cBasisStat;
    uVar25 = (ulong)(uVar24 & 0x7fffffff);
    lVar22 = uVar25 + 1;
    lVar23 = uVar25 << 4;
    do {
      (**(code **)(**(long **)((long)&(this_00->data).
                                      super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start[-1].
                                      super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr + lVar23) + 0x10))();
      plVar8 = *(long **)((long)&(this_00->data).
                                 super__Vector_base<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start[-1].
                                 super___shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr + lVar23);
      (**(code **)(*plVar8 + 0x20))
                (plVar8,local_448,local_450,local_458,local_428,local_430,&this->m_rBasisStat,
                 isOptimal);
      std::
      vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
      ::resize(&this_00->data,lVar22 - 2);
      lVar22 = lVar22 + -1;
      lVar23 = lVar23 + -0x10;
    } while (1 < lVar22);
  }
  if (this->m_thesense == MAXIMIZE) {
    pnVar12 = (this->m_redCost).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_redCost).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12) >> 7)) {
      pnVar9 = (this->m_redCost).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar10 = (this->m_redCost).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar22 = 0x78;
      lVar23 = 0;
      do {
        pbVar1 = (byte *)((long)(pnVar12->m_backend).data._M_elems + lVar22 + -4);
        *pbVar1 = *pbVar1 ^ (*(int *)((long)(pnVar12->m_backend).data._M_elems + lVar22 + -0x78) !=
                             0 || *(int *)((long)(pnVar12->m_backend).data._M_elems + lVar22) != 0);
        lVar23 = lVar23 + 1;
        lVar22 = lVar22 + 0x80;
        pnVar12 = pnVar9;
      } while (lVar23 < (int)((ulong)((long)pnVar10 - (long)pnVar9) >> 7));
    }
    pnVar12 = (this->m_dual).val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(this->m_dual).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pnVar12) >> 7)) {
      pnVar9 = (this->m_dual).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar10 = (this->m_dual).val.
                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      lVar22 = 0x78;
      lVar23 = 0;
      do {
        pbVar1 = (byte *)((long)(pnVar12->m_backend).data._M_elems + lVar22 + -4);
        *pbVar1 = *pbVar1 ^ (*(int *)((long)(pnVar12->m_backend).data._M_elems + lVar22 + -0x78) !=
                             0 || *(int *)((long)(pnVar12->m_backend).data._M_elems + lVar22) != 0);
        lVar23 = lVar23 + 1;
        lVar22 = lVar22 + 0x80;
        pnVar12 = pnVar9;
      } while (lVar23 < (int)((ulong)((long)pnVar10 - (long)pnVar9) >> 7));
    }
  }
  if (0 < this->m_addedcols) {
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->m_prim,
            (int)((ulong)((long)(this->m_prim).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_prim).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 7) - this->m_addedcols,
            true);
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::reDim(&this->m_redCost,
            (int)((ulong)((long)(this->m_redCost).val.
                                super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(this->m_redCost).val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) >> 7) - this->m_addedcols,
            true);
    DataArray<soplex::SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::VarStatus>
    ::reSize(&this->m_cBasisStat,(this->m_cBasisStat).thesize - this->m_addedcols);
    DataArray<int>::reSize(&this->m_cIdx,(this->m_cIdx).thesize - this->m_addedcols);
  }
  std::
  vector<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>,_std::allocator<std::shared_ptr<soplex::SPxMainSM<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::PostStep>_>_>
  ::clear(&this_00->data);
  this->m_postsolved = true;
  return;
}

Assistant:

void SPxMainSM<R>::unsimplify(const VectorBase<R>& x, const VectorBase<R>& y,
                              const VectorBase<R>& s, const VectorBase<R>& r,
                              const typename SPxSolverBase<R>::VarStatus rows[],
                              const typename SPxSolverBase<R>::VarStatus cols[], bool isOptimal)
{
   SPX_MSG_INFO1((*this->spxout),
                 (*this->spxout) << " --- unsimplifying solution and basis" << std::endl;)
   assert(x.dim() <= m_prim.dim());
   assert(y.dim() <= m_dual.dim());
   assert(x.dim() == r.dim());
   assert(y.dim() == s.dim());

   // assign values of variables in reduced LP
   // NOTE: for maximization problems, we have to switch signs of dual and reduced cost values,
   // since simplifier assumes minimization problem
   for(int j = 0; j < x.dim(); ++j)
   {
      m_prim[j] = isZero(x[j], this->epsZero()) ? 0.0 : x[j];
      m_redCost[j] = isZero(r[j], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -r[j] :
                     r[j]);
      m_cBasisStat[j] = cols[j];
   }

   for(int i = 0; i < y.dim(); ++i)
   {
      m_dual[i] = isZero(y[i], this->epsZero()) ? 0.0 : (m_thesense == SPxLPBase<R>::MAXIMIZE ? -y[i] :
                  y[i]);
      m_slack[i] = isZero(s[i], this->epsZero()) ? 0.0 : s[i];
      m_rBasisStat[i] = rows[i];
   }

   // undo preprocessing
   for(int k = m_hist.size() - 1; k >= 0; --k)
   {
      SPxOut::debug(this, "unsimplifying {} \n", m_hist[k]->getName());

      try
      {
         m_hist[k]->execute(m_prim, m_dual, m_slack, m_redCost, m_cBasisStat, m_rBasisStat, isOptimal);
      }
      catch(const SPxException& ex)
      {
         SPX_MSG_INFO1((*this->spxout), (*this->spxout) << "Exception thrown while unsimplifying " <<
                       m_hist[k]->getName() << ":\n" << ex.what() << "\n");
         throw SPxInternalCodeException("XMAISM00 Exception thrown during unsimply().");
      }

      m_hist.reSize(k);
   }

   // for maximization problems, we have to switch signs of dual and reduced cost values back
   if(m_thesense == SPxLPBase<R>::MAXIMIZE)
   {
      for(int j = 0; j < m_redCost.dim(); ++j)
         m_redCost[j] = -m_redCost[j];

      for(int i = 0; i < m_dual.dim(); ++i)
         m_dual[i] = -m_dual[i];
   }

   if(m_addedcols > 0)
   {
      assert(m_prim.dim() >= m_addedcols);
      m_prim.reDim(m_prim.dim() - m_addedcols);
      m_redCost.reDim(m_redCost.dim() - m_addedcols);
      m_cBasisStat.reSize(m_cBasisStat.size() - m_addedcols);
      m_cIdx.reSize(m_cIdx.size() - m_addedcols);
   }

#ifdef SOPLEX_CHECK_BASIS_DIM
   int numBasis = 0;

   for(int rs = 0; rs < m_rBasisStat.size(); ++rs)
   {
      if(m_rBasisStat[rs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   for(int cs = 0; cs < m_cBasisStat.size(); ++cs)
   {
      if(m_cBasisStat[cs] == SPxSolverBase<R>::BASIC)
         numBasis ++;
   }

   if(numBasis != m_rBasisStat.size())
   {
      throw SPxInternalCodeException("XMAISM26 Dimension doesn't match after this step.");
   }

#endif

   m_hist.clear();
   m_postsolved = true;
}